

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O1

int inet_ntop4(uchar *src,char *dst,size_t size)

{
  uint uVar1;
  int iVar2;
  char tmp [16];
  char local_28 [24];
  
  uVar1 = snprintf(local_28,0x10,"%u.%u.%u.%u",(ulong)*src,(ulong)src[1],(ulong)src[2],(uint)src[3])
  ;
  iVar2 = -0x1c;
  if (uVar1 < size && 0 < (int)uVar1) {
    uv__strscpy(dst,local_28,size);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static char *inet_ntop4 (const unsigned char *src, char *dst, size_t size)
{
  char tmp[sizeof("255.255.255.255")];
  size_t len;

  DEBUGASSERT(size >= 16);

  tmp[0] = '\0';
  (void)snprintf(tmp, sizeof(tmp), "%d.%d.%d.%d",
                 ((int)((unsigned char)src[0])) & 0xff,
                 ((int)((unsigned char)src[1])) & 0xff,
                 ((int)((unsigned char)src[2])) & 0xff,
                 ((int)((unsigned char)src[3])) & 0xff);

  len = strlen(tmp);
  if(len == 0 || len >= size) {
    errno = ENOSPC;
    return (NULL);
  }
  strcpy(dst, tmp);
  return dst;
}